

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<slang::logic_t_&>::streamReconstructedExpression
          (UnaryExpr<slang::logic_t_&> *this,ostream *os)

{
  enable_if_t<_::Catch::Detail::IsStreamInsertable<logic_t>::value,_std::string> local_30;
  
  StringMaker<slang::logic_t,_void>::convert<slang::logic_t>(&local_30,this->m_lhs);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }